

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O1

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 *extraout_RDX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 local_18;
  long local_10;
  
  iVar2 = (int)&local_18;
  local_10 = (long)status;
  local_18 = 0;
  if (local_10 == 0) {
    iVar1 = uv_tcp_init(server->loop,&connection);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001ce28b;
    iVar1 = uv_accept(server,&connection);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 == 0) {
      iVar1 = uv_read_start(&connection,on_alloc,on_read1);
      local_10 = (long)iVar1;
      local_18 = 0;
      if (local_10 == 0) {
        return;
      }
      goto LAB_001ce2a5;
    }
  }
  else {
    on_connection_cold_1();
LAB_001ce28b:
    on_connection_cold_2();
  }
  on_connection_cold_3();
LAB_001ce2a5:
  on_connection_cold_4();
  if (iVar2 == 0) {
    do_write((uv_stream_t *)&client,on_write_close_immediately);
    return;
  }
  on_connect_cold_1();
  *extraout_RDX = on_alloc::slab;
  extraout_RDX[1] = 0x10000;
  return;
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  struct sockaddr sockname, peername;
  int namelen;
  uv_tcp_t* handle;
  int r;

  if (status != 0) {
    fprintf(stderr, "Connect error %s\n", uv_err_name(status));
  }
  ASSERT_OK(status);

  handle = malloc(sizeof(*handle));
  ASSERT_NOT_NULL(handle);

  r = uv_tcp_init(loop, handle);
  ASSERT_OK(r);

  /* associate server with stream */
  handle->data = server;

  r = uv_accept(server, (uv_stream_t*)handle);
  ASSERT_OK(r);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname(handle, &sockname, &namelen);
  ASSERT_OK(r);
  check_sockname(&sockname, "127.0.0.1", server_port, "accepted socket");
  getsocknamecount_tcp++;

  namelen = sizeof peername;
  r = uv_tcp_getpeername(handle, &peername, &namelen);
  ASSERT_OK(r);
  check_sockname(&peername, "127.0.0.1", connect_port, "accepted socket peer");
  getpeernamecount++;

  r = uv_read_start((uv_stream_t*)handle, alloc, after_read);
  ASSERT_OK(r);
}